

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::ProfileThunk(RecyclableObject *callable,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  int n;
  BOOL BVar4;
  JavascriptFunction *this;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  Var *values;
  ScriptContext *this_00;
  ThreadContext *this_01;
  HostScriptContext *requestHostScriptContext;
  FunctionInfo *this_02;
  ScriptFunction *this_03;
  ProxyEntryPointInfo *pPVar7;
  FunctionProxy *this_04;
  char16 *pcVar8;
  Var pvVar9;
  Arguments local_d8;
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  FunctionInfo *funcInfo;
  JavascriptMethod entryPoint;
  ScriptContext *scriptContext;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  JavascriptFunction *function;
  RecyclableObject *callable_local;
  CallInfo callInfo_local;
  
  this = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(callable);
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  if (TVar3 != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x171,"(function->GetTypeId() == TypeIds_Function)",
                                "function->GetTypeId() == TypeIds_Function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
  if (p_Var6 != ProfileThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x172,"(function->GetEntryPoint() == CrossSite::ProfileThunk)",
                                "function->GetEntryPoint() == CrossSite::ProfileThunk");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x173,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar4 = RecyclableObject::IsExternal((RecyclableObject *)this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  requestHostScriptContext = ThreadContext::GetPreviousHostScriptContext(this_01);
  ScriptContext::VerifyAliveWithHostContext
            (this_00,(uint)((BVar4 != 0 ^ 0xffU) & 1),requestHostScriptContext);
  this_02 = JavascriptFunction::GetFunctionInfo(this);
  bVar2 = VarIs<Js::WasmScriptFunction,Js::JavascriptFunction>(this);
  if (bVar2) {
    funcInfo = (FunctionInfo *)AsmJsExternalEntryPoint;
  }
  else {
    BVar4 = FunctionInfo::HasBody(this_02);
    if (BVar4 == 0) {
      funcInfo = (FunctionInfo *)ScriptContext::DebugProfileProbeThunk;
    }
    else {
      this_03 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(this);
      pPVar7 = ScriptFunction::GetEntryPointInfo(this_03);
      funcInfo = (FunctionInfo *)pPVar7->jsMethod;
      bVar2 = FunctionInfo::IsDeferred(this_02);
      if ((bVar2) && (BVar4 = ScriptContext::IsProfiling(this_00), BVar4 != 0)) {
        funcInfo = (FunctionInfo *)ScriptContext::GetProfileModeThunk((JavascriptMethod)funcInfo);
      }
      this_04 = FunctionInfo::GetFunctionProxy(this_02);
      pcVar8 = FunctionProxy::GetDebugNumberSet(this_04,(wchar (*) [42])local_c8);
      Output::Trace(ScriptProfilerPhase,
                    L"CrossSite::ProfileThunk FunctionNumber : %s, Entrypoint : 0x%08X\n",pcVar8,
                    funcInfo);
    }
  }
  Arguments::Arguments(&local_d8,(Arguments *)local_48);
  pvVar9 = CommonThunk((RecyclableObject *)this,(JavascriptMethod)funcInfo,&local_d8);
  return pvVar9;
}

Assistant:

Var CrossSite::ProfileThunk(RecyclableObject* callable, CallInfo callInfo, ...)
    {
        JavascriptFunction* function = VarTo<JavascriptFunction>(callable);
        Assert(function->GetTypeId() == TypeIds_Function);
        Assert(function->GetEntryPoint() == CrossSite::ProfileThunk);
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext * scriptContext = function->GetScriptContext();
        // It is not safe to access the function body if the script context is not alive.
        scriptContext->VerifyAliveWithHostContext(!function->IsExternal(),
            scriptContext->GetThreadContext()->GetPreviousHostScriptContext());

        JavascriptMethod entryPoint;
        FunctionInfo *funcInfo = function->GetFunctionInfo();

        TTD_XSITE_LOG(callable->GetScriptContext(), "DefaultOrProfileThunk", callable);

#ifdef ENABLE_WASM
        if (VarIs<WasmScriptFunction>(function))
        {
            entryPoint = Js::AsmJsExternalEntryPoint;
        } else
#endif
        if (funcInfo->HasBody())
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            entryPoint = VarTo<ScriptFunction>(function)->GetEntryPointInfo()->jsMethod;
            if (funcInfo->IsDeferred() && scriptContext->IsProfiling())
            {
                // if the current entrypoint is deferred parse we need to update it appropriately for the profiler mode.
                entryPoint = Js::ScriptContext::GetProfileModeThunk(entryPoint);
            }
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("CrossSite::ProfileThunk FunctionNumber : %s, Entrypoint : 0x%08X\n"), funcInfo->GetFunctionProxy()->GetDebugNumberSet(debugStringBuffer), entryPoint);
        }
        else
        {
            entryPoint = ProfileEntryThunk;
        }


        return CommonThunk(function, entryPoint, args);
    }